

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O3

Result * __thiscall
CoreML::LinearModel::setOffsets
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<double,_std::allocator<double>_> *offsets)

{
  RepeatedField<double> *this_00;
  double dVar1;
  Model *this_01;
  ulong uVar2;
  double *pdVar3;
  GLMRegressor *pGVar4;
  double *pdVar5;
  uint uVar6;
  Arena *arena;
  double *pdVar7;
  
  this_01 = (this->super_Model).m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_01->_oneof_case_[0] == 300) {
    pGVar4 = (this_01->Type_).glmregressor_;
  }
  else {
    Specification::Model::clear_Type(this_01);
    this_01->_oneof_case_[0] = 300;
    uVar2 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pGVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GLMRegressor>(arena)
    ;
    (this_01->Type_).glmregressor_ = pGVar4;
  }
  pdVar7 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (offsets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar7 != pdVar3) {
    this_00 = &pGVar4->offset_;
    uVar6 = (pGVar4->offset_).current_size_;
    do {
      dVar1 = *pdVar7;
      if (uVar6 == (pGVar4->offset_).total_size_) {
        google::protobuf::RepeatedField<double>::Reserve(this_00,uVar6 + 1);
        pdVar5 = google::protobuf::RepeatedField<double>::elements(this_00);
        pdVar5[uVar6] = dVar1;
      }
      else {
        pdVar5 = google::protobuf::RepeatedField<double>::elements(this_00);
        pdVar5[uVar6] = dVar1;
      }
      uVar6 = uVar6 + 1;
      this_00->current_size_ = uVar6;
      pdVar7 = pdVar7 + 1;
    } while (pdVar7 != pdVar3);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setOffsets(std::vector<double> offsets) {
        auto lr = m_spec->mutable_glmregressor();
        for(double n : offsets) {
            lr->add_offset(n);
        }
        return Result();
    }